

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.h
# Opt level: O0

void __thiscall
OpenSSLWrapper::SslServerContext::SslServerContext(SslServerContext *this,SslServerContext *src)

{
  SslServerContext *src_local;
  SslServerContext *this_local;
  
  SslContext::SslContext(&this->super_SslContext,&src->super_SslContext);
  (this->super_SslContext)._vptr_SslContext = (_func_int **)&PTR__SslServerContext_001b9098;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_vstrAlpnProtoList);
  std::__cxx11::string::operator=
            ((string *)&(this->super_SslContext).m_strCertComName,
             (string *)&(src->super_SslContext).m_strCertComName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SslContext).m_vstrAltNames,&(src->super_SslContext).m_vstrAltNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_vstrAlpnProtoList,&src->m_vstrAlpnProtoList);
  return;
}

Assistant:

explicit SslServerContext(SslServerContext&& src) noexcept : SslContext(move(src))
        {
            m_strCertComName = move(src.m_strCertComName);
            m_vstrAltNames = move(src.m_vstrAltNames);
            m_vstrAlpnProtoList = move(src.m_vstrAlpnProtoList);
        }